

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# task_scheduler.c
# Opt level: O3

HT_Boolean ht_task_scheduler_remove_task(HT_TaskScheduler *task_scheduler,HT_TaskId task_id)

{
  void *ptr;
  ulong uVar1;
  ulong uVar2;
  size_t i;
  size_t n;
  
  if ((-1 < task_id) && (uVar1 = (task_scheduler->tasks).size, uVar1 != 0)) {
    uVar2 = 0;
    do {
      ptr = (task_scheduler->tasks).data[uVar2];
      if (*(int *)((long)ptr + 0x20) == task_id) {
        n = 0;
        do {
          if ((task_scheduler->tasks).data[n] == ptr) {
            ht_bag_void_ptr_remove_nth(&task_scheduler->tasks,n);
            uVar1 = (task_scheduler->tasks).size;
          }
          n = n + 1;
        } while (n < uVar1);
        ht_free(ptr);
        return 1;
      }
      uVar2 = uVar2 + 1;
    } while (uVar1 != uVar2);
  }
  return 0;
}

Assistant:

HT_Boolean
ht_task_scheduler_remove_task(HT_TaskScheduler* task_scheduler, HT_TaskId task_id)
{
    size_t i;

    if (task_id < 0)
    {
        return HT_FALSE;
    }

    for (i = 0; i < task_scheduler->tasks.size; i++)
    {
        HT_Task* task = HT_TASK(task_scheduler->tasks.data[i]);
        if (task->id == task_id)
        {
            ht_task_scheduler_remove_task_entry(&task_scheduler->tasks, task);
            ht_free(task);
            return HT_TRUE;
        }
    }

    return HT_FALSE;
}